

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::LocalDistribution::~LocalDistribution(LocalDistribution *this)

{
  Node *pNVar1;
  Distributor *in_RDI;
  RawNode *n_1;
  QNode *n;
  ThreadData *ti;
  MPSCPtrQueue *in_stack_ffffffffffffffc8;
  
  in_RDI->_vptr_Distributor = (_func_int **)&PTR__LocalDistribution_002df370;
  while (*(int *)&in_RDI[2]._vptr_Distributor != 0) {
    *(int *)&in_RDI[2]._vptr_Distributor = *(int *)&in_RDI[2]._vptr_Distributor + -1;
    in_RDI[1]._vptr_Distributor[*(uint *)&in_RDI[2]._vptr_Distributor] = (_func_int *)0x0;
    while (pNVar1 = MPSCPtrQueue::pop(in_stack_ffffffffffffffc8), pNVar1 != (Node *)0x0) {
      SharedLiterals::release((SharedLiterals *)0x21fe07);
    }
    alignedFree((void *)0x21fe15);
  }
  while (in_stack_ffffffffffffffc8 =
              (MPSCPtrQueue *)Detail::RawStack::tryPop((RawStack *)in_stack_ffffffffffffffc8),
        in_stack_ffffffffffffffc8 != (MPSCPtrQueue *)0x0) {
    alignedFree((void *)0x21fe4a);
  }
  if (in_RDI[1]._vptr_Distributor != (_func_int **)0x0) {
    operator_delete__(in_RDI[1]._vptr_Distributor);
  }
  Distributor::~Distributor(in_RDI);
  return;
}

Assistant:

LocalDistribution::~LocalDistribution() {
	while (numThread_) {
		ThreadData* ti      = thread_[--numThread_];
		thread_[numThread_] = 0;
		for (QNode* n; (n = ti->received.pop()) != 0; ) {
			static_cast<SharedLiterals*>(n->data)->release();
		}
		ti->~ThreadData();
		alignedFree(ti);
	}
	for (MPSCPtrQueue::RawNode* n; (n = blocks_.tryPop()) != 0; ) {
		alignedFree(n);
	}
	delete [] thread_;
}